

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

size_t deqp::gls::anon_unknown_1::getElementCount(Primitive primitive,size_t primitiveCount)

{
  size_t local_30;
  size_t primitiveCount_local;
  size_t sStack_10;
  Primitive primitive_local;
  
  switch(primitive) {
  case PRIMITIVE_POINTS:
    sStack_10 = primitiveCount;
    break;
  case PRIMITIVE_TRIANGLES:
    sStack_10 = primitiveCount * 3;
    break;
  case PRIMITIVE_TRIANGLE_FAN:
    sStack_10 = primitiveCount + 2;
    break;
  case PRIMITIVE_TRIANGLE_STRIP:
    sStack_10 = primitiveCount + 2;
    break;
  case PRIMITIVE_LINES:
    sStack_10 = primitiveCount << 1;
    break;
  case PRIMITIVE_LINE_STRIP:
    sStack_10 = primitiveCount + 1;
    break;
  case PRIMITIVE_LINE_LOOP:
    local_30 = primitiveCount;
    if (primitiveCount == 1) {
      local_30 = 2;
    }
    sStack_10 = local_30;
    break;
  case PRIMITIVE_LINES_ADJACENCY:
    sStack_10 = primitiveCount << 2;
    break;
  case PRIMITIVE_LINE_STRIP_ADJACENCY:
    sStack_10 = primitiveCount + 3;
    break;
  case PRIMITIVE_TRIANGLES_ADJACENCY:
    sStack_10 = primitiveCount * 6;
    break;
  case PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
    sStack_10 = primitiveCount * 2 + 4;
    break;
  default:
    sStack_10 = 0;
  }
  return sStack_10;
}

Assistant:

static size_t getElementCount (DrawTestSpec::Primitive primitive, size_t primitiveCount)
{
	switch (primitive)
	{
		case DrawTestSpec::PRIMITIVE_POINTS:						return primitiveCount;
		case DrawTestSpec::PRIMITIVE_TRIANGLES:						return primitiveCount * 3;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_FAN:					return primitiveCount + 2;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP:				return primitiveCount + 2;
		case DrawTestSpec::PRIMITIVE_LINES:							return primitiveCount * 2;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP:					return primitiveCount + 1;
		case DrawTestSpec::PRIMITIVE_LINE_LOOP:						return (primitiveCount==1) ? (2) : (primitiveCount);
		case DrawTestSpec::PRIMITIVE_LINES_ADJACENCY:				return primitiveCount * 4;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP_ADJACENCY:			return primitiveCount + 3;
		case DrawTestSpec::PRIMITIVE_TRIANGLES_ADJACENCY:			return primitiveCount * 6;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:		return primitiveCount * 2 + 4;
		default:
			DE_ASSERT(false);
			return 0;
	}
}